

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_dump_node(yaml_emitter_t *emitter,int index)

{
  int anchor_id_00;
  yaml_node_type_t yVar1;
  yaml_node_t *node_00;
  yaml_char_t *local_38;
  yaml_char_t *anchor;
  int anchor_id;
  yaml_node_t *node;
  int index_local;
  yaml_emitter_t *emitter_local;
  
  node_00 = (emitter->document->nodes).start + (long)index + -1;
  anchor_id_00 = emitter->anchors[index + -1].anchor;
  local_38 = (yaml_char_t *)0x0;
  if ((anchor_id_00 == 0) ||
     (local_38 = yaml_emitter_generate_anchor(emitter,anchor_id_00), local_38 != (yaml_char_t *)0x0)
     ) {
    if (emitter->anchors[index + -1].serialized == 0) {
      emitter->anchors[index + -1].serialized = 1;
      yVar1 = node_00->type;
      if (yVar1 == YAML_SCALAR_NODE) {
        emitter_local._4_4_ = yaml_emitter_dump_scalar(emitter,node_00,local_38);
      }
      else if (yVar1 == YAML_SEQUENCE_NODE) {
        emitter_local._4_4_ = yaml_emitter_dump_sequence(emitter,node_00,local_38);
      }
      else {
        if (yVar1 != YAML_MAPPING_NODE) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                        ,0x121,"int yaml_emitter_dump_node(yaml_emitter_t *, int)");
        }
        emitter_local._4_4_ = yaml_emitter_dump_mapping(emitter,node_00,local_38);
      }
    }
    else {
      emitter_local._4_4_ = yaml_emitter_dump_alias(emitter,local_38);
    }
  }
  else {
    emitter_local._4_4_ = 0;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_dump_node(yaml_emitter_t *emitter, int index)
{
    yaml_node_t *node = emitter->document->nodes.start + index - 1;
    int anchor_id = emitter->anchors[index-1].anchor;
    yaml_char_t *anchor = NULL;

    if (anchor_id) {
        anchor = yaml_emitter_generate_anchor(emitter, anchor_id);
        if (!anchor) return 0;
    }

    if (emitter->anchors[index-1].serialized) {
        return yaml_emitter_dump_alias(emitter, anchor);
    }

    emitter->anchors[index-1].serialized = 1;

    switch (node->type) {
        case YAML_SCALAR_NODE:
            return yaml_emitter_dump_scalar(emitter, node, anchor);
        case YAML_SEQUENCE_NODE:
            return yaml_emitter_dump_sequence(emitter, node, anchor);
        case YAML_MAPPING_NODE:
            return yaml_emitter_dump_mapping(emitter, node, anchor);
        default:
            assert(0);      /* Could not happen. */
            break;
    }

    return 0;       /* Could not happen. */
}